

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O3

int run_test_loop_update_time(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  uint64_t uVar3;
  ulong uVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_a8 [16];
  uv_timer_t uStack_98;
  uv_loop_t *puStack_20;
  long local_18;
  long local_10;
  
  puStack_20 = (uv_loop_t *)0x1a8d76;
  puVar2 = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x1a8d7e;
  loop = (uv_loop_t *)uv_now(puVar2);
  puStack_20 = (uv_loop_t *)0x1a8d86;
  puVar2 = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x1a8d8e;
  uVar3 = uv_now(puVar2);
  uVar4 = uVar3 - (long)loop;
  while (uVar4 < 1000) {
    puStack_20 = (uv_loop_t *)0x1a8d9e;
    puVar2 = uv_default_loop();
    puStack_20 = (uv_loop_t *)0x1a8dab;
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) {
      puStack_20 = (uv_loop_t *)0x1a8e41;
      run_test_loop_update_time_cold_1();
      goto LAB_001a8e41;
    }
    puStack_20 = (uv_loop_t *)0x1a8dca;
    puVar2 = uv_default_loop();
    puStack_20 = (uv_loop_t *)0x1a8dd2;
    uVar3 = uv_now(puVar2);
    uVar4 = uVar3 - (long)loop;
  }
  puStack_20 = (uv_loop_t *)0x1a8de2;
  loop = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x1a8df6;
  uv_walk(loop,close_walk_cb,(void *)0x0);
  puStack_20 = (uv_loop_t *)0x1a8e00;
  uv_run(loop,UV_RUN_DEFAULT);
  local_10 = 0;
  puStack_20 = (uv_loop_t *)0x1a8e0e;
  puVar2 = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x1a8e16;
  iVar1 = uv_loop_close(puVar2);
  local_18 = (long)iVar1;
  if (local_10 == local_18) {
    puStack_20 = (uv_loop_t *)0x1a8e2c;
    uv_library_shutdown();
    return 0;
  }
LAB_001a8e41:
  puStack_20 = (uv_loop_t *)run_test_loop_backend_timeout;
  run_test_loop_update_time_cold_2();
  puStack_20 = loop;
  puVar2 = uv_default_loop();
  puVar2->active_handles = puVar2->active_handles + 1;
  iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
  uStack_98.data = (void *)0x1;
  auStack_a8._0_8_ = SEXT48(iVar1);
  if ((uv_loop_t *)auStack_a8._0_8_ == (uv_loop_t *)0x1) {
    puVar2->active_handles = puVar2->active_handles - 1;
    iVar1 = uv_loop_alive(puVar2);
    uStack_98.data = (void *)(long)iVar1;
    auStack_a8._0_8_ = (uv_loop_t *)0x0;
    if (uStack_98.data != (void *)0x0) goto LAB_001a904a;
    iVar1 = uv_timer_init(puVar2,&uStack_98);
    auStack_a8._0_8_ = SEXT48(iVar1);
    auStack_a8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_a8._0_8_ != (uv_loop_t *)0x0) goto LAB_001a9059;
    iVar1 = uv_loop_alive(puVar2);
    auStack_a8._0_8_ = SEXT48(iVar1);
    auStack_a8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_a8._0_8_ != (uv_loop_t *)0x0) goto LAB_001a9068;
    iVar1 = uv_backend_timeout(puVar2);
    auStack_a8._0_8_ = SEXT48(iVar1);
    auStack_a8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_a8._0_8_ != (uv_loop_t *)0x0) goto LAB_001a9077;
    iVar1 = uv_timer_start(&uStack_98,cb,1000,0);
    auStack_a8._0_8_ = SEXT48(iVar1);
    auStack_a8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_a8._0_8_ != (uv_loop_t *)0x0) goto LAB_001a9086;
    auStack_a8._0_8_ = (uv_loop_t *)0x3e8;
    iVar1 = uv_backend_timeout(puVar2);
    auStack_a8._8_8_ = SEXT48(iVar1);
    if (auStack_a8._0_8_ != auStack_a8._8_8_) goto LAB_001a9095;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_a8._0_8_ = SEXT48(iVar1);
    auStack_a8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_a8._0_8_ != (uv_loop_t *)0x0) goto LAB_001a90a4;
    iVar1 = uv_backend_timeout(puVar2);
    auStack_a8._0_8_ = SEXT48(iVar1);
    auStack_a8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_a8._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_a8._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(puVar2);
      auStack_a8._8_8_ = SEXT48(iVar1);
      if (auStack_a8._0_8_ == auStack_a8._8_8_) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001a90c2;
    }
  }
  else {
    run_test_loop_backend_timeout_cold_1();
LAB_001a904a:
    run_test_loop_backend_timeout_cold_2();
LAB_001a9059:
    run_test_loop_backend_timeout_cold_3();
LAB_001a9068:
    run_test_loop_backend_timeout_cold_4();
LAB_001a9077:
    run_test_loop_backend_timeout_cold_5();
LAB_001a9086:
    run_test_loop_backend_timeout_cold_6();
LAB_001a9095:
    run_test_loop_backend_timeout_cold_7();
LAB_001a90a4:
    run_test_loop_backend_timeout_cold_8();
  }
  run_test_loop_backend_timeout_cold_9();
LAB_001a90c2:
  handle = (uv_handle_t *)auStack_a8;
  run_test_loop_backend_timeout_cold_10();
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(loop_update_time) {
  uint64_t start;

  start = uv_now(uv_default_loop());
  while (uv_now(uv_default_loop()) - start < 1000)
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}